

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::SupportedCombinationTest::iterate(SupportedCombinationTest *this)

{
  GLenum GVar1;
  bool bVar2;
  FormatFlags FVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  _Self __tmp_1;
  _Self __tmp;
  FormatDB *this_00;
  ImageFormat none;
  _Self __tmp_2;
  FormatCombination comb;
  Formats depthFmts;
  Formats stencilFmts;
  Formats colorFmts;
  ImageFormat local_f8;
  _Rb_tree_node_base *local_f0;
  FormatCombination local_e4;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_c0;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_90;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_60;
  
  this_00 = &((this->super_TestBase).m_ctx)->m_coreFormats;
  local_f8.format = 0;
  local_f8.unsizedType = 0;
  deqp::gls::FboUtil::FormatDB::getFormats((Formats *)&local_60,this_00,COLOR_RENDERABLE);
  deqp::gls::FboUtil::FormatDB::getFormats((Formats *)&local_c0,this_00,DEPTH_RENDERABLE);
  deqp::gls::FboUtil::FormatDB::getFormats((Formats *)&local_90,this_00,STENCIL_RENDERABLE);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
  ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
            ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
              *)&local_60,&local_f8);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
  ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
            ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
              *)&local_c0,&local_f8);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
  ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
            ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
              *)&local_90,&local_f8);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    bVar2 = false;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_e4.colorFmt.format = p_Var6[1]._M_color;
      local_e4.colorFmt.unsizedType = *(GLenum *)&p_Var6[1].field_0x4;
      p_Var5 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      GVar1 = 0;
      if (local_e4.colorFmt.format != 0) {
        FVar3 = deqp::gls::FboUtil::FormatDB::getFormatInfo
                          (&((this->super_TestBase).m_ctx)->m_coreFormats,local_e4.colorFmt);
        p_Var5 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
        GVar1 = 0x8d41;
        if ((FVar3 & RENDERBUFFER_VALID) == ANY_FORMAT) {
          GVar1 = 0x1702;
        }
      }
      for (; local_e4.colorKind = GVar1, local_f0 = p_Var6,
          (_Rb_tree_header *)p_Var5 != &local_c0._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        local_e4.depthFmt.format = p_Var5[1]._M_color;
        local_e4.depthFmt.unsizedType = *(GLenum *)&p_Var5[1].field_0x4;
        if (local_e4.depthFmt.format == 0) {
          local_e4.depthKind = 0;
          p_Var4 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        else {
          FVar3 = deqp::gls::FboUtil::FormatDB::getFormatInfo
                            (&((this->super_TestBase).m_ctx)->m_coreFormats,local_e4.depthFmt);
          local_e4.depthKind = 0x8d41;
          p_Var4 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((FVar3 & RENDERBUFFER_VALID) == ANY_FORMAT) {
            local_e4.depthKind = 0x1702;
          }
        }
        for (; (_Rb_tree_header *)p_Var4 != &local_90._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          local_e4.stencilFmt.format = p_Var4[1]._M_color;
          local_e4.stencilFmt.unsizedType = *(GLenum *)&p_Var4[1].field_0x4;
          if (local_e4.stencilFmt.format == 0) {
            local_e4.stencilKind = 0;
          }
          else {
            FVar3 = deqp::gls::FboUtil::FormatDB::getFormatInfo
                              (&((this->super_TestBase).m_ctx)->m_coreFormats,local_e4.stencilFmt);
            local_e4.stencilKind = 0x8d41;
            if ((FVar3 & RENDERBUFFER_VALID) == ANY_FORMAT) {
              local_e4.stencilKind = 0x1702;
            }
          }
          bVar2 = tryCombination(this,&local_e4);
          if (bVar2) break;
        }
        p_Var6 = local_f0;
        GVar1 = local_e4.colorKind;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_f0);
    } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
    if (bVar2 != false) {
      deqp::gls::fboc::details::TestBase::pass(&this->super_TestBase);
      goto LAB_00fd9043;
    }
  }
  deqp::gls::fboc::details::TestBase::fail
            (&this->super_TestBase,"No supported format combination found");
LAB_00fd9043:
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&local_60);
  return STOP;
}

Assistant:

IterateResult SupportedCombinationTest::iterate (void)
{
	const FormatDB& db		= m_ctx.getCoreFormats();
	const ImageFormat none	= ImageFormat::none();
	Formats colorFmts		= db.getFormats(COLOR_RENDERABLE);
	Formats depthFmts		= db.getFormats(DEPTH_RENDERABLE);
	Formats stencilFmts		= db.getFormats(STENCIL_RENDERABLE);
	FormatCombination comb;
	bool succ = false;

	colorFmts.insert(none);
	depthFmts.insert(none);
	stencilFmts.insert(none);

	for (Formats::const_iterator col = colorFmts.begin(); col != colorFmts.end(); col++)
	{
		comb.colorFmt = *col;
		comb.colorKind = formatKind(*col);
		for (Formats::const_iterator dep = depthFmts.begin(); dep != depthFmts.end(); dep++)
		{
			comb.depthFmt = *dep;
			comb.depthKind = formatKind(*dep);
			for (Formats::const_iterator stc = stencilFmts.begin();
				 stc != stencilFmts.end(); stc++)
			{
				comb.stencilFmt = *stc;
				comb.stencilKind = formatKind(*stc);
				succ = tryCombination(comb);
				if (succ)
					break;
			}
		}
	}

	if (succ)
		pass();
	else
		fail("No supported format combination found");

	return STOP;
}